

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O0

curltime Curl_now(void)

{
  curltime cVar1;
  undefined1 local_28 [8];
  timeval now;
  curltime ret;
  
  gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
  cVar1.tv_usec = (undefined4)now.tv_sec;
  cVar1.tv_sec = (time_t)local_28;
  cVar1._12_4_ = 0;
  return cVar1;
}

Assistant:

struct curltime Curl_now(void)
{
  /*
  ** gettimeofday() is not granted to be increased monotonically, due to
  ** clock drifting and external source time synchronization it can jump
  ** forward or backward in time.
  */
  struct timeval now;
  struct curltime ret;
  (void)gettimeofday(&now, NULL);
  ret.tv_sec = now.tv_sec;
  ret.tv_usec = (int)now.tv_usec;
  return ret;
}